

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

RESULT_TYPE_conflict __thiscall
duckdb::Interpolator<true>::InterpolateInternal<short,duckdb::QuantileDirect<short>>
          (Interpolator<true> *this,short *v_t,QuantileDirect<short> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>_>_> __comp;
  ulong uVar4;
  undefined7 uStack_17;
  
  iVar1 = this->begin;
  iVar2 = this->end;
  if (this->FRN != iVar2 && iVar1 != iVar2) {
    uVar4 = (long)((iVar2 * 2 - iVar1) - iVar1) >> 1;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp._M_comp._17_7_ = uStack_17;
    __comp._M_comp.desc = this->desc;
    __comp._M_comp.accessor_r = accessor;
    __comp._M_comp.accessor_l = accessor;
    ::std::
    __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>>>>
              (v_t + iVar1,v_t + this->FRN,v_t + iVar2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               __comp);
  }
  return v_t[this->FRN];
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}